

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O3

void Assimp::FBX::Tokenize(TokenList *output_tokens,char *input)

{
  pointer *pppTVar1;
  byte bVar2;
  iterator iVar3;
  bool bVar4;
  bool bVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  anon_union_8_2_0c989700_for_Token_4 aVar9;
  anon_union_8_2_0c989700_for_Token_4 aVar10;
  uint column;
  uint line;
  bool bVar11;
  char *token_end;
  char *token_begin;
  byte *local_60;
  byte *local_58;
  string local_50;
  
  local_58 = (byte *)0x0;
  local_60 = (byte *)0x0;
  column = 1;
  bVar11 = false;
  bVar8 = false;
  bVar5 = false;
  line = 1;
  do {
    bVar2 = *input;
    if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
      line = line + 1;
      column = 0;
LAB_005d2fad:
      if (bVar8) {
        pbVar6 = (byte *)input;
        pbVar7 = local_58;
        if (bVar2 == 0x22) {
LAB_005d303a:
          local_60 = pbVar6;
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_58,(char **)&local_60,line,column,TokenType_DATA,
                     false);
LAB_005d305c:
          bVar8 = false;
          bVar5 = false;
          bVar11 = false;
        }
        else {
LAB_005d31a5:
          local_58 = pbVar7;
          bVar8 = true;
          bVar11 = false;
        }
      }
      else {
        if (bVar2 < 0x22) {
          if (((bVar2 - 9 < 2) || (bVar2 - 0xc < 2)) || (bVar2 == 0x20)) {
            pbVar6 = local_60;
            if (local_58 != (byte *)0x0) goto LAB_005d303a;
            goto LAB_005d305c;
          }
LAB_005d31d1:
          if (local_58 == (byte *)0x0) {
            local_58 = (byte *)input;
          }
          bVar5 = true;
          local_60 = (byte *)input;
LAB_005d31f9:
          bVar11 = false;
        }
        else {
          if (bVar2 < 0x3b) {
            if (bVar2 == 0x22) {
              pbVar7 = (byte *)input;
              if (local_58 != (byte *)0x0) {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"unexpected double-quote","");
                anon_unknown_3::TokenizeError(&local_50,line,column);
              }
              goto LAB_005d31a5;
            }
            if (bVar2 == 0x2c) {
              if (bVar5) {
                anon_unknown_3::ProcessDataToken
                          (output_tokens,(char **)&local_58,(char **)&local_60,line,column,
                           TokenType_DATA,true);
              }
              local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
              ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
              ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
              ((Token *)local_50._M_dataplus._M_p)->type = TokenType_COMMA;
LAB_005d3107:
              aVar9.line._4_4_ = 0;
              aVar9.line._0_4_ = line;
              ((Token *)local_50._M_dataplus._M_p)->field_3 = aVar9;
              ((Token *)local_50._M_dataplus._M_p)->column = column;
              iVar3._M_current =
                   (output_tokens->
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (output_tokens->
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
                _M_realloc_insert<Assimp::FBX::Token_const*>
                          ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>
                            *)output_tokens,iVar3,(Token **)&local_50);
              }
              else {
                *iVar3._M_current = (Token *)local_50._M_dataplus._M_p;
                pppTVar1 = &(output_tokens->
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *pppTVar1 = *pppTVar1 + 1;
              }
            }
            else {
              if (bVar2 != 0x3a) goto LAB_005d31d1;
              if (!bVar5) {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"unexpected colon","");
                anon_unknown_3::TokenizeError(&local_50,line,column);
              }
              anon_unknown_3::ProcessDataToken
                        (output_tokens,(char **)&local_58,(char **)&local_60,line,column,
                         TokenType_KEY,true);
            }
            goto LAB_005d31f9;
          }
          if (bVar2 != 0x3b) {
            if (bVar2 == 0x7b) {
              anon_unknown_3::ProcessDataToken
                        (output_tokens,(char **)&local_58,(char **)&local_60,line,column,
                         TokenType_DATA,false);
              local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
              ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
              ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
              ((Token *)local_50._M_dataplus._M_p)->type = TokenType_OPEN_BRACKET;
              aVar10.line._4_4_ = 0;
              aVar10.line._0_4_ = line;
              ((Token *)local_50._M_dataplus._M_p)->field_3 = aVar10;
              ((Token *)local_50._M_dataplus._M_p)->column = column;
              iVar3._M_current =
                   (output_tokens->
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (output_tokens->
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
                _M_realloc_insert<Assimp::FBX::Token_const*>
                          ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>
                            *)output_tokens,iVar3,(Token **)&local_50);
              }
              else {
                *iVar3._M_current = (Token *)local_50._M_dataplus._M_p;
                pppTVar1 = &(output_tokens->
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *pppTVar1 = *pppTVar1 + 1;
              }
              bVar8 = false;
              bVar11 = false;
              goto LAB_005d31fd;
            }
            if (bVar2 == 0x7d) {
              anon_unknown_3::ProcessDataToken
                        (output_tokens,(char **)&local_58,(char **)&local_60,line,column,
                         TokenType_DATA,false);
              local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
              ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
              ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
              ((Token *)local_50._M_dataplus._M_p)->type = TokenType_CLOSE_BRACKET;
              goto LAB_005d3107;
            }
            goto LAB_005d31d1;
          }
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_58,(char **)&local_60,line,column,TokenType_DATA,
                     false);
          bVar11 = true;
        }
        bVar8 = false;
      }
    }
    else {
      if (bVar2 == 0) {
        return;
      }
      bVar4 = !bVar11;
      bVar11 = true;
      if (bVar4) goto LAB_005d2fad;
    }
LAB_005d31fd:
    column = column + (uint)(*input == 9) * 3 + 1;
    input = (char *)((byte *)input + 1);
  } while( true );
}

Assistant:

void Tokenize(TokenList& output_tokens, const char* input)
{
    ai_assert(input);

    // line and column numbers numbers are one-based
    unsigned int line = 1;
    unsigned int column = 1;

    bool comment = false;
    bool in_double_quotes = false;
    bool pending_data_token = false;

    const char* token_begin = NULL, *token_end = NULL;
    for (const char* cur = input;*cur;column += (*cur == '\t' ? ASSIMP_FBX_TAB_WIDTH : 1), ++cur) {
        const char c = *cur;

        if (IsLineEnd(c)) {
            comment = false;

            column = 0;
            ++line;
        }

        if(comment) {
            continue;
        }

        if(in_double_quotes) {
            if (c == '\"') {
                in_double_quotes = false;
                token_end = cur;

                ProcessDataToken(output_tokens,token_begin,token_end,line,column);
                pending_data_token = false;
            }
            continue;
        }

        switch(c)
        {
        case '\"':
            if (token_begin) {
                TokenizeError("unexpected double-quote", line, column);
            }
            token_begin = cur;
            in_double_quotes = true;
            continue;

        case ';':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            comment = true;
            continue;

        case '{':
            ProcessDataToken(output_tokens,token_begin,token_end, line, column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_OPEN_BRACKET,line,column));
            continue;

        case '}':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_CLOSE_BRACKET,line,column));
            continue;

        case ',':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_DATA,true);
            }
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_COMMA,line,column));
            continue;

        case ':':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_KEY,true);
            }
            else {
                TokenizeError("unexpected colon", line, column);
            }
            continue;
        }

        if (IsSpaceOrNewLine(c)) {

            if (token_begin) {
                // peek ahead and check if the next token is a colon in which
                // case this counts as KEY token.
                TokenType type = TokenType_DATA;
                for (const char* peek = cur;  *peek && IsSpaceOrNewLine(*peek); ++peek) {
                    if (*peek == ':') {
                        type = TokenType_KEY;
                        cur = peek;
                        break;
                    }
                }

                ProcessDataToken(output_tokens,token_begin,token_end,line,column,type);
            }

            pending_data_token = false;
        }
        else {
            token_end = cur;
            if (!token_begin) {
                token_begin = cur;
            }

            pending_data_token = true;
        }
    }
}